

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg.c
# Opt level: O0

keypress internal_borg_inkey(wchar_t flush_first)

{
  _Bool _Var1;
  keycode_t kVar2;
  errr eVar3;
  wchar_t wVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 uVar7;
  bool bVar8;
  keypress kVar9;
  undefined1 local_450;
  int local_448;
  wchar_t k;
  _Bool borg_prompt;
  char *buf;
  char buffer [1024];
  int local_30;
  int iStack_2c;
  uint8_t t_a;
  wchar_t x;
  wchar_t y;
  ui_event ch_evt;
  keycode_t borg_ch;
  wchar_t flush_first_local;
  keypress key;
  
  _borg_ch = 1;
  key.type = EVT_NONE;
  iStack_2c = 0;
  local_30 = (Term->wid + -1) / (int)(uint)tile_width;
  ch_evt._8_4_ = flush_first;
  Term_locate(&local_30,&stack0xffffffffffffffd4);
  Term_fresh();
  if ((borg_active & 1U) == 0) {
    borg_note("# Removing keypress hook");
    inkey_hack = (_func_keypress_int *)0x0;
    borg_flush();
    flush(EVENT_MAP,(game_event_data *)0x0,(void *)0x0);
    if (key_mode == L'\x01') {
      option_set("rogue_like_commands",1);
      uVar7 = extraout_RDX_00;
    }
    else {
      uVar7 = extraout_RDX;
      if (key_mode == L'\0') {
        option_set("rogue_like_commands",0);
        uVar7 = extraout_RDX_01;
      }
    }
    _borg_ch = 0xe00000000001;
  }
  else {
    if ((ch_evt._8_4_ != 0) && (kVar2 = borg_inkey(false), kVar2 != 0)) {
      borg_note("# Flushing keypress buffer");
      borg_flush();
      if (0xfa < borg.time_this_panel) {
        borg_respawning = 3;
      }
    }
    bVar8 = false;
    borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,(uint8_t *)(buffer + 0x3ff),
                   (char *)&buf);
    pcVar5 = borg_trim((char *)&buf);
    if ((buffer[0x3ff] != '\0') &&
       ((((*pcVar5 != ' ' || (pcVar5[1] != ' ')) || (pcVar5[2] != ' ')) || (pcVar5[3] != ' ')))) {
      bVar8 = true;
    }
    uVar7 = extraout_RDX_02;
    if ((bVar8) && (_Var1 = prefix(pcVar5,"Type"), uVar7 = extraout_RDX_03, _Var1)) {
      bVar8 = false;
    }
    if (((!bVar8) || ((inkey_flag & 1U) != 0)) ||
       ((sVar6 = strlen(pcVar5), uVar7 = extraout_RDX_04, sVar6 == 0 ||
        (_Var1 = borg_react_prompted(pcVar5,(keypress *)&borg_ch,local_30,iStack_2c),
        uVar7 = extraout_RDX_05, !_Var1)))) {
      if ((player->is_dead & 1U) == 0) {
        if (((((bVar8) && ((inkey_flag & 1U) == 0)) && (iStack_2c == 0)) &&
            ((6 < local_30 &&
             (eVar3 = borg_what_text(local_30 + L'\xfffffff9',L'\0',L'\a',
                                     (uint8_t *)(buffer + 0x3ff),(char *)&buf),
             uVar7 = extraout_RDX_07, eVar3 == 0)))) &&
           (_Var1 = suffix((char *)&buf," -more-"), uVar7 = extraout_RDX_08, _Var1)) {
          if (*borg_cfg != 0) {
            borg_note("# message with -more-");
          }
          eVar3 = borg_what_text(L'\0',L'\0',local_30 + L'\xfffffff9',(uint8_t *)(buffer + 0x3ff),
                                 (char *)&buf);
          uVar7 = extraout_RDX_09;
          if (eVar3 == 0) {
            borg_parse((char *)&buf);
            uVar7 = extraout_RDX_10;
          }
          if (*borg_cfg != 0) {
            borg_note("clearing -more-");
            uVar7 = extraout_RDX_11;
          }
          _borg_ch = CONCAT44(0x20,borg_ch);
        }
        else if ((character_dungeon & 1U) == 0) {
          if (*borg_cfg != 0) {
            borg_note("# Mid reincarnation, no map yet");
            uVar7 = extraout_RDX_12;
          }
          _borg_ch = CONCAT44(0x9c,borg_ch);
          borg_respawning = borg_respawning + -1;
          if (borg_respawning < 1) {
            borg_oops("reincarnation failure");
            uVar7 = extraout_RDX_13;
          }
        }
        else if ((bVar8) && ((inkey_flag & 1U) != 0)) {
          if (*borg_cfg != 0) {
            borg_note("# parse normal message");
          }
          eVar3 = borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,
                                 (uint8_t *)(buffer + 0x3ff),(char *)&buf);
          uVar7 = extraout_RDX_14;
          if (eVar3 == 0) {
            sVar6 = strlen((char *)&buf);
            local_448 = (int)sVar6;
            while( true ) {
              bVar8 = false;
              if (0 < local_448) {
                bVar8 = *(char *)((long)&buf + (long)(local_448 + -1)) == ' ';
              }
              if (!bVar8) break;
              local_448 = local_448 + -1;
            }
            *(char *)((long)&buf + (long)local_448) = '\0';
            borg_parse((char *)&buf);
            uVar7 = extraout_RDX_15;
          }
          _borg_ch = CONCAT44(0x20,borg_ch);
        }
        else {
          borg_parse((char *)0x0);
          borg_dont_react = false;
          ch_evt.key.code = borg_inkey(true);
          if (ch_evt.key.code == 0) {
            Term_inkey((ui_event *)&x,false,true);
            if (0 < borg.trait[0x69]) {
              borg.in_shop = false;
            }
            if (((((borg.in_shop & 1U) == 0) && ((x & 1U) != 0)) && (y != L'\0')) && (y != L'\n')) {
              if (((uint)y < 0x20) || (0x7e < (uint)y)) {
                pcVar5 = format("# User key press <%lu>",(ulong)(uint)y);
                borg_note(pcVar5);
              }
              else {
                pcVar5 = format("# User key press <%lu><%c>",(ulong)(uint)y,
                                (ulong)(uint)(int)(char)y);
                borg_note(pcVar5);
              }
              pcVar5 = format("# Key type was <%d><%c>",(ulong)(uint)x,(ulong)(uint)x);
              borg_note(pcVar5);
              borg_oops("user abort");
              _borg_ch = CONCAT44(0xe000,borg_ch);
              uVar7 = extraout_RDX_18;
            }
            else {
              if ((x & 0x40U) != 0) {
                x = L'\x01';
              }
              if ((x & 0x20U) != 0) {
                x = L'\x01';
              }
              uVar7 = extraout_RDX_17;
              if ((player->upkeep->resting == L'\0') &&
                 (wVar4 = cmd_get_nrepeats(), uVar7 = extraout_RDX_19, wVar4 < L'\x01')) {
                borg_confirm_target = false;
                borg_rand_quick = (_Bool)(Rand_quick & 1);
                borg_rand_value = Rand_value;
                Rand_quick = true;
                Rand_value = borg_rand_local;
                do {
                  _Var1 = borg_think();
                } while (((_Var1 ^ 0xffU) & 1) != 0);
                borg_status();
                borg_rand_local = Rand_value;
                Rand_quick = (_Bool)(borg_rand_quick & 1);
                Rand_value = borg_rand_value;
                if ((borg_step != 0) && (borg_step = borg_step - 1, borg_step == 0)) {
                  borg_cancel = true;
                }
                ch_evt.key.code = borg_inkey(true);
                if (ch_evt.key.code == 0) {
                  borg_oops("normal abort");
                  _borg_ch = CONCAT44(0xe000,borg_ch);
                  uVar7 = extraout_RDX_21;
                }
                else {
                  _borg_ch = CONCAT44(ch_evt.key.code,borg_ch);
                  uVar7 = extraout_RDX_20;
                }
              }
              else {
                _borg_ch = _borg_ch & 0xffffffff00000000;
              }
            }
          }
          else {
            _borg_ch = CONCAT44(ch_evt.key.code,borg_ch);
            uVar7 = extraout_RDX_16;
          }
        }
      }
      else {
        if ((borg_cfg[0x1d] <= borg.trait[0x23]) ||
           (pcVar5 = strstr(player->died_from,"starvation"), pcVar5 != (char *)0x0)) {
          borg_write_map(false);
        }
        borg_log_death();
        borg_log_death_data();
        borg_flush();
        borg_parse((char *)0x0);
        borg_clear_reactions();
        borg_oops("player died");
        _borg_ch = CONCAT44(3,borg_ch);
        uVar7 = extraout_RDX_06;
      }
    }
  }
  local_450 = (undefined1)key.type;
  kVar9._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar7 >> 8),local_450);
  kVar9.type = borg_ch;
  kVar9.code = flush_first_local;
  return kVar9;
}

Assistant:

static struct keypress internal_borg_inkey(int flush_first)
{
    keycode_t       borg_ch;
    struct keypress key = { EVT_KBRD, 0, 0 };

    ui_event ch_evt;

    int y = 0;
    int x = ((Term->wid /* - (COL_MAP)*/ - 1) / (tile_width));

    uint8_t t_a;

    char buffer[1024];
    char *buf = buffer;

    bool borg_prompt; /* ajg  For now we can just use this locally.
                          in the 283 borg he uses this to optimize knowing if
                          we are waiting at a prompt for info */
    /* Locate the cursor */
    (void)Term_locate(&x, &y);

    /* Refresh the screen */
    Term_fresh();

    /* Deactivate */
    if (!borg_active) {
        /* Message */
        borg_note("# Removing keypress hook");

        /* Remove hook */
        inkey_hack = NULL;

        /* Flush keys */
        borg_flush();

        /* Flush */
        flush(0, 0, 0);

        /* Restore user key mode */
        if (key_mode == KEYMAP_MODE_ROGUE) {
            option_set("rogue_like_commands", true);
        } else if (key_mode == KEYMAP_MODE_ORIG) {
            option_set("rogue_like_commands", false);
        }

        /* Done */
        /* HACK need to flush the key buffer to change modes */
        key.type = EVT_KBRD;
        key.code = ESCAPE;
        return key;
    }

    /* Mega-Hack -- flush keys */
    if (flush_first) {
        /* Only flush if needed */
        if (borg_inkey(false) != 0) {
            /* Message */
            borg_note("# Flushing keypress buffer");

            /* Flush keys */
            borg_flush();

            /* Cycle a few times to catch up if needed */
            if (borg.time_this_panel > 250) {
                borg_respawning = 3;
            }
        }
    }

    /* Assume no prompt/message is available */
    borg_prompt = false;

    /* due to changes in the way messages are handled sometimes the code */
    /* seems to be getting blanks before the message or blanks then -more- */
    /* trying to see if I can code around this. */

    /* get everything on the message line */
    buf = buffer;
    borg_what_text(0, 0, ((Term->wid - 1) / (tile_width)), &t_a, buffer);
#if 0
    /* just used for debugging.  Not so useful in general */
    if (borg_cfg[BORG_VERBOSE])
        borg_note(format("got message '%s'", buf));
#endif 
    /* Trim whitespace */
    buf = borg_trim(buf);

    /* Mega-Hack -- check for possible prompts/messages */
    /* If the first four characters on the message line all */
    /* have the same attribute (or are all spaces), and they */
    /* are not all spaces (ascii value 0x20)... */
    if ((t_a != COLOUR_DARK)
        && (buf[0] != ' ' || buf[1] != ' ' || buf[2] != ' ' || buf[3] != ' ')) {
        /* Assume a prompt/message is available */
        borg_prompt = true;
    }

    if (borg_prompt && prefix(buf, "Type")) {
        borg_prompt = false;
    }

    /* handle the messages the borg has to react to immediately */
    if (borg_prompt && !inkey_flag && strlen(buf)) {
        if (borg_react_prompted(buf, &key, x, y))
            return key;
    }

    /* Mega-Hack -- Handle death */
    if (player->is_dead) {
#ifndef BABLOS
        /* Print the map */
        if (borg.trait[BI_CLEVEL] >= borg_cfg[BORG_DUMP_LEVEL]
            || strstr(player->died_from, "starvation"))
            borg_write_map(false);

        /* Log death */
        borg_log_death();
        borg_log_death_data();
#if 0
        /* Note the score */
        borg_enter_score();
#endif
#endif /* bablos */
        /* flush the buffer */
        borg_flush();
        borg_parse(NULL);
        borg_clear_reactions();

        /* Oops  */
        borg_oops("player died");

        /* Useless keypress */
        key.code = KTRL('C');
        return key;
    }

    /* Mega-Hack -- Catch "-more-" messages */
    /* If there is text on the first line... */
    /* And the game does not want a command... */
    /* And the cursor is on the top line... */
    /* And there is text before the cursor... */
    /* And that text is "-more-" */
    buf = buffer;
    if (borg_prompt && !inkey_flag && (y == 0) && (x >= 7)
        && (0 == borg_what_text(x - 7, y, 7, &t_a, buffer))
        && (suffix(buf, " -more-"))) {

        if (borg_cfg[BORG_VERBOSE])
            borg_note("# message with -more-");

        /* Get the message */
        if (0 == borg_what_text(0, 0, x - 7, &t_a, buffer)) {
            /* Parse it */
            borg_parse(buf);
        }
        /* Clear the message */
        if (borg_cfg[BORG_VERBOSE])
            borg_note("clearing -more-");
        key.code = ' ';
        return key;
    }

    /* in the odd case where a we get here before the message */
    /* about cheating death comes up.  */
    if (!character_dungeon) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# Mid reincarnation, no map yet");
        /* do nothing */
        key.code = KC_ENTER;

        /* there is an odd case I can't track down where the borg */
        /* tries to respawn but gets caught in a loop. */
        borg_respawning--;
        if (borg_respawning <= 0)
            borg_oops("reincarnation failure");

        return key;
    }

    /* Mega-Hack -- catch normal messages */
    /* If there is text on the first line... */
    /* And the game wants a command */
    if (borg_prompt && inkey_flag) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# parse normal message");
        /* Get the message(s) */
        buf = buffer;
        if (0
            == borg_what_text(
                0, 0, ((Term->wid - 1) / (tile_width)), &t_a, buffer)) {
            int k = strlen(buf);

            /* Strip trailing spaces */
            while ((k > 0) && (buf[k - 1] == ' '))
                k--;

            /* Terminate */
            buf[k] = '\0';

            /* Parse it */
            borg_parse(buf);
        }

        /* Clear the message */
        key.code = ' ';
        return key;
    }
    /* Flush messages */
    borg_parse(NULL);
    borg_dont_react = false;

    /* Check for key */
    borg_ch = borg_inkey(true);

    /* Use the key */
    if (borg_ch) {
        key.code = borg_ch;
        return key;
    }

    /* Check for user abort */
    (void)Term_inkey(&ch_evt, false, true);

    /* Hack to keep him active in town. */
    if (borg.trait[BI_CDEPTH] >= 1)
        borg.in_shop = false;

    if (!borg.in_shop && (ch_evt.type & EVT_KBRD) && ch_evt.key.code > 0
        && ch_evt.key.code != 10) {
        /* Oops */
        if (ch_evt.key.code >= 32 && ch_evt.key.code <= 126) {
            borg_note(format("# User key press <%lu><%c>",
                (unsigned long)ch_evt.key.code, (char)ch_evt.key.code));
        } else {
            borg_note(format("# User key press <%lu>",
                (unsigned long)ch_evt.key.code));
        }
        borg_note(format("# Key type was <%d><%c>", ch_evt.type, ch_evt.type));
        borg_oops("user abort");

        /* Hack -- Escape */
        key.code = ESCAPE;
        return key;
    }

    /* for some reason, selling and buying in the store sets the event handler
     * to Select. */
    if (ch_evt.type & EVT_SELECT)
        ch_evt.type = EVT_KBRD;
    if (ch_evt.type & EVT_MOVE)
        ch_evt.type = EVT_KBRD;

    /* Don't interrupt our own resting or a repeating command */
    if (player->upkeep->resting || cmd_get_nrepeats() > 0) {
        key.type = EVT_NONE;
        return key;
    }

    /* done with buffered and repeated commands, the confirm should be done*/
    borg_confirm_target = false;

    /* Save the system random info */
    borg_rand_quick = Rand_quick;
    borg_rand_value = Rand_value;

    /* Use the local random info */
    Rand_quick = true;
    Rand_value = borg_rand_local;

    /* Think */
    while (!borg_think()) /* loop */
        ;

    /* DVE- Update the status screen */
    borg_status();

    /* Save the local random info */
    borg_rand_local = Rand_value;

    /* Restore the system random info */
    Rand_quick = borg_rand_quick;
    Rand_value = borg_rand_value;

    /* Hack -- allow stepping to induce a clean cancel */
    if (borg_step && (!--borg_step))
        borg_cancel = true;

    /* Check for key */
    borg_ch = borg_inkey(true);

    /* Use the key */
    if (borg_ch) {
        key.code = borg_ch;
        return key;
    }

    /* Oops */
    borg_oops("normal abort");

    /* Hack -- Escape */
    key.code = ESCAPE;
    return key;
}